

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O3

UniquePtr<SSL_CTX> __thiscall TestConfig::SetupCtx(TestConfig *this,SSL_CTX *old_ctx)

{
  uint8_t *list;
  uint8_t *puVar1;
  long lVar2;
  SSL_QUIC_METHOD *prefs;
  SSL_QUIC_METHOD *pSVar3;
  void *in;
  _Alloc_hider name_list;
  int iVar4;
  SSL_METHOD *meth;
  SSL_CTX *ctx;
  CRYPTO_BUFFER_POOL *pCVar5;
  byte bVar6;
  SSL_CTX *in_RDX;
  UniquePtr<SSL_CTX> ssl_ctx;
  string cipher_list;
  UniquePtr<struct_stack_st_X509_NAME> names;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_80;
  long *local_78 [2];
  long local_68 [2];
  string local_58;
  
  if (*(char *)((long)&old_ctx->x509_method + 1) == '\x01') {
    meth = (SSL_METHOD *)DTLS_method();
  }
  else {
    meth = (SSL_METHOD *)TLS_method();
  }
  ctx = (SSL_CTX *)SSL_CTX_new(meth);
  local_80._M_head_impl = ctx;
  if (ctx == (SSL_CTX *)0x0) {
    this->port = 0;
    this->ipv6 = false;
    *(undefined3 *)&this->field_0x5 = 0;
    goto LAB_00125969;
  }
  if (BufferPool()::pool == '\0') {
    iVar4 = __cxa_guard_acquire(&BufferPool()::pool);
    if (iVar4 != 0) {
      pCVar5 = CRYPTO_BUFFER_POOL_new();
      if (pCVar5 == (CRYPTO_BUFFER_POOL *)0x0) goto LAB_001259bf;
      BufferPool()::pool = pCVar5;
      __cxa_guard_release(&BufferPool()::pool);
    }
  }
  SSL_CTX_set0_buffer_pool(ctx,BufferPool()::pool);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"ALL:TLS_ECDHE_RSA_WITH_AES_128_CBC_SHA256","");
  if (old_ctx[1].cert_compression_algs.capacity_ != 0) {
    std::__cxx11::string::_M_assign((string *)local_78);
    SSL_CTX_set_options(local_80._M_head_impl,0x400000);
  }
  iVar4 = SSL_CTX_set_strict_cipher_list(local_80._M_head_impl,(char *)local_78[0]);
  if (iVar4 == 0) {
LAB_0012594b:
    this->port = 0;
    this->ipv6 = false;
    *(undefined3 *)&this->field_0x5 = 0;
  }
  else {
    if ((*(char *)((long)&old_ctx->legacy_ocsp_callback_arg + 1) == '\x01') &&
       (*(char *)&old_ctx->x509_method == '\x01')) {
      SSL_CTX_set_session_cache_mode(local_80._M_head_impl,0x303);
      SSL_CTX_sess_set_get_cb((SSL_CTX *)local_80._M_head_impl,GetSessionCallback);
    }
    else {
      SSL_CTX_set_session_cache_mode(local_80._M_head_impl,3);
    }
    SSL_CTX_set_select_certificate_cb(local_80._M_head_impl,SelectCertificateCallback);
    if (old_ctx[2].lock.__data.__pad1[5] == '\x01') {
      SSL_CTX_set_client_cert_cb((SSL_CTX *)local_80._M_head_impl,ClientCertCallback);
    }
    SSL_CTX_set_next_protos_advertised_cb
              ((SSL_CTX *)local_80._M_head_impl,NextProtosAdvertisedCallback,(void *)0x0);
    if ((old_ctx->pool != (CRYPTO_BUFFER_POOL *)0x0) ||
       (*(char *)&old_ctx->legacy_ocsp_callback_arg == '\x01')) {
      SSL_CTX_set_next_proto_select_cb
                ((SSL_CTX *)local_80._M_head_impl,NextProtoSelectCallback,(void *)0x0);
    }
    if ((((old_ctx[1].app_verify_callback != (_func_int_X509_STORE_CTX_ptr_void_ptr *)0x0) ||
         (*(char *)&old_ctx[1].default_passwd_callback != '\0')) ||
        (*(char *)((long)&old_ctx[1].default_passwd_callback + 1) != '\0')) ||
       (*(char *)((long)&old_ctx[1].default_passwd_callback + 2) == '\x01')) {
      SSL_CTX_set_alpn_select_cb(local_80._M_head_impl,AlpnSelectCallback,(void *)0x0);
    }
    SSL_CTX_set_current_time_cb(local_80._M_head_impl,CurrentTimeCallback);
    SSL_CTX_set_info_callback((SSL_CTX *)local_80._M_head_impl,InfoCallback);
    SSL_CTX_sess_set_new_cb((SSL_CTX *)local_80._M_head_impl,NewSessionCallback);
    if (*(char *)((long)&old_ctx[1].verify_sigalgs.size_ + 2) == '\x01') {
      SSL_CTX_set_ticket_aead_method(local_80._M_head_impl,&g_async_ticket_aead_method);
    }
    else if ((*(char *)((long)&old_ctx[1].verify_sigalgs.size_ + 1) != '\0') ||
            (*(char *)((long)&old_ctx[2].requested_trust_anchors.
                              super__Optional_base<bssl::Array<unsigned_char>,_false,_false>.
                              _M_payload.
                              super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>
                              .super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload
                      + 2) == '\x01')) {
      SSL_CTX_set_tlsext_ticket_key_cb(local_80._M_head_impl,TicketKeyCallback);
    }
    if (*(char *)((long)&old_ctx[2].ex_data.sk + 7) == '\0') {
      SSL_CTX_set_cert_verify_callback
                ((SSL_CTX *)local_80._M_head_impl,CertVerifyCallback,(void *)0x0);
    }
    list = (uint8_t *)old_ctx[2].lock.__align;
    puVar1 = *(uint8_t **)((long)&old_ctx[2].lock + 8);
    if (list != puVar1) {
      iVar4 = SSL_CTX_set_signed_cert_timestamp_list
                        (local_80._M_head_impl,list,(long)puVar1 - (long)list);
      if (iVar4 == 0) goto LAB_0012594b;
    }
    lVar2._0_2_ = old_ctx[2].conf_max_version;
    lVar2._2_2_ = old_ctx[2].conf_min_version;
    lVar2._4_1_ = old_ctx[2].num_tickets;
    lVar2._5_3_ = *(undefined3 *)&old_ctx[2].field_0x55;
    if (lVar2 != 0) {
      iVar4 = std::__cxx11::string::compare(old_ctx[2].lock.__size + 0x30);
      if (iVar4 == 0) {
        SSL_CTX_set_client_CA_list((SSL_CTX *)local_80._M_head_impl,(stack_st_X509_NAME *)0x0);
      }
      else {
        iVar4 = std::__cxx11::string::compare(old_ctx[2].lock.__size + 0x30);
        if (iVar4 == 0) {
          local_58._M_dataplus._M_p = (pointer)0x0;
          SSL_CTX_set_client_CA_list((SSL_CTX *)local_80._M_head_impl,(stack_st_X509_NAME *)0x0);
        }
        else {
          DecodeHexX509Names(&local_58);
          name_list._M_p = local_58._M_dataplus._M_p;
          local_58._M_dataplus._M_p = (pointer)0x0;
          SSL_CTX_set_client_CA_list
                    ((SSL_CTX *)local_80._M_head_impl,(stack_st_X509_NAME *)name_list._M_p);
        }
        std::unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter> *)&local_58);
      }
    }
    if (*(char *)((long)&old_ctx[2].session_cache_tail + 2) == '\x01') {
      SSL_CTX_set_grease_enabled(local_80._M_head_impl,1);
    }
    if (*(char *)((long)&old_ctx[2].session_cache_tail + 3) == '\x01') {
      SSL_CTX_set_permute_extensions(local_80._M_head_impl,1);
    }
    if ((old_ctx->CA_names)._M_t.
        super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl !=
        (stack_st_CRYPTO_BUFFER *)0x0) {
      SSL_CTX_set_tlsext_servername_callback(local_80._M_head_impl,ServerNameCallback);
    }
    if (*(char *)((long)&old_ctx[1].verify_sigalgs.size_ + 5) == '\x01') {
      SSL_CTX_set_early_data_enabled(local_80._M_head_impl,1);
    }
    if (*(char *)((long)&old_ctx[2].ex_data.sk + 6) == '\x01') {
      SSL_CTX_set_allow_unknown_alpn_protos(local_80._M_head_impl,1);
    }
    prefs = old_ctx->quic_method;
    pSVar3 = (SSL_QUIC_METHOD *)
             (old_ctx->cipher_list)._M_t.
             super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>._M_head_impl;
    if (prefs != pSVar3) {
      iVar4 = SSL_CTX_set_verify_algorithm_prefs
                        (local_80._M_head_impl,(uint16_t *)prefs,(long)pSVar3 - (long)prefs >> 1);
      if (iVar4 == 0) goto LAB_0012594b;
    }
    SSL_CTX_set_msg_callback((SSL_CTX *)local_80._M_head_impl,MessageCallback);
    if (*(char *)&old_ctx[2].requested_trust_anchors.
                  super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
                  super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
                  super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload == '\x01') {
      SSL_CTX_set_false_start_allowed_without_alpn(local_80._M_head_impl,1);
    }
    if (*(char *)((long)&old_ctx[2].requested_trust_anchors.
                         super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
                         super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
                         super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload + 4)
        == '\x01') {
      SSL_CTX_set_tlsext_status_cb(local_80._M_head_impl,LegacyOCSPCallback);
    }
    if (*(char *)((long)&old_ctx[2].cert_compression_algs.data_ + 4) == '\x01') {
      SSL_CTX_set_resumption_across_names_enabled(local_80._M_head_impl,1);
    }
    if (in_RDX != (SSL_CTX *)0x0) {
      iVar4 = SSL_CTX_get_tlsext_ticket_keys(in_RDX,&local_58,0x30);
      if (iVar4 != 0) {
        iVar4 = SSL_CTX_set_tlsext_ticket_keys(local_80._M_head_impl,&local_58,0x30);
        if (iVar4 != 0) {
          CopySessions(local_80._M_head_impl,in_RDX);
          goto LAB_00125844;
        }
      }
      goto LAB_0012594b;
    }
    in = *(void **)&old_ctx[2].handshakes_since_cache_flush;
    if (in != *(void **)&old_ctx[2].session_timeout) {
      iVar4 = SSL_CTX_set_tlsext_ticket_keys
                        (local_80._M_head_impl,in,
                         (long)*(void **)&old_ctx[2].session_timeout - (long)in);
      if (iVar4 == 0) goto LAB_0012594b;
    }
LAB_00125844:
    bVar6 = *(byte *)((long)&old_ctx[2].requested_trust_anchors.
                             super__Optional_base<bssl::Array<unsigned_char>,_false,_false>.
                             _M_payload.
                             super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>
                             .super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload +
                     8);
    iVar4 = *(int *)((long)&old_ctx[2].requested_trust_anchors.
                            super__Optional_base<bssl::Array<unsigned_char>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
                            super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload +
                    0xc);
    if ((iVar4 == 0xff02 | bVar6) == 1) {
      iVar4 = SSL_CTX_add_cert_compression_alg
                        (local_80._M_head_impl,0xff02,SetupCtx::anon_class_1_0_00000001::__invoke,
                         SetupCtx::anon_class_1_0_00000001::__invoke);
      if (iVar4 != 0) {
        bVar6 = *(byte *)((long)&old_ctx[2].requested_trust_anchors.
                                 super__Optional_base<bssl::Array<unsigned_char>,_false,_false>.
                                 _M_payload.
                                 super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>
                                 .super__Optional_payload_base<bssl::Array<unsigned_char>_>.
                                 _M_payload + 8);
        iVar4 = *(int *)((long)&old_ctx[2].requested_trust_anchors.
                                super__Optional_base<bssl::Array<unsigned_char>,_false,_false>.
                                _M_payload.
                                super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>
                                .super__Optional_payload_base<bssl::Array<unsigned_char>_>.
                                _M_payload + 0xc);
        goto LAB_00125894;
      }
LAB_001259ba:
      SetupCtx();
LAB_001259bf:
      abort();
    }
LAB_00125894:
    if (iVar4 == 0xff01 || (bVar6 & 1) != 0) {
      iVar4 = SSL_CTX_add_cert_compression_alg
                        (local_80._M_head_impl,0xff01,SetupCtx::anon_class_1_0_00000001::__invoke,
                         SetupCtx::anon_class_1_0_00000001::__invoke);
      if (iVar4 == 0) goto LAB_001259ba;
      bVar6 = *(byte *)((long)&old_ctx[2].requested_trust_anchors.
                               super__Optional_base<bssl::Array<unsigned_char>,_false,_false>.
                               _M_payload.
                               super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>
                               .super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload
                       + 8);
      iVar4 = *(int *)((long)&old_ctx[2].requested_trust_anchors.
                              super__Optional_base<bssl::Array<unsigned_char>,_false,_false>.
                              _M_payload.
                              super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>
                              .super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload
                      + 0xc);
    }
    if (((bVar6 & 1) != 0) || (iVar4 == 0xff03)) {
      iVar4 = SSL_CTX_add_cert_compression_alg
                        (local_80._M_head_impl,0xff03,SetupCtx::anon_class_1_0_00000001::__invoke,
                         SetupCtx::anon_class_1_0_00000001::__invoke);
      if (iVar4 == 0) goto LAB_001259ba;
    }
    if (*(char *)((long)&old_ctx[2].msg_callback_arg + 1) == '\x01') {
      SSL_CTX_set_options(local_80._M_head_impl,0x400000);
    }
    if (*(char *)((long)&old_ctx->x509_method + 2) == '\x01') {
      SSL_CTX_set_quic_method(local_80._M_head_impl,&g_quic_method);
    }
    *(ssl_ctx_st **)this = local_80._M_head_impl;
    local_80._M_head_impl = (SSL_CTX *)0x0;
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
LAB_00125969:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_80);
  return (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

bssl::UniquePtr<SSL_CTX> TestConfig::SetupCtx(SSL_CTX *old_ctx) const {
  bssl::UniquePtr<SSL_CTX> ssl_ctx(
      SSL_CTX_new(is_dtls ? DTLS_method() : TLS_method()));
  if (!ssl_ctx) {
    return nullptr;
  }

  SSL_CTX_set0_buffer_pool(ssl_ctx.get(), BufferPool());

  std::string cipher_list = "ALL:TLS_ECDHE_RSA_WITH_AES_128_CBC_SHA256";
  if (!cipher.empty()) {
    cipher_list = cipher;
    SSL_CTX_set_options(ssl_ctx.get(), SSL_OP_CIPHER_SERVER_PREFERENCE);
  }
  if (!SSL_CTX_set_strict_cipher_list(ssl_ctx.get(), cipher_list.c_str())) {
    return nullptr;
  }

  if (async && is_server) {
    // Disable the internal session cache. To test asynchronous session lookup,
    // we use an external session cache.
    SSL_CTX_set_session_cache_mode(
        ssl_ctx.get(), SSL_SESS_CACHE_BOTH | SSL_SESS_CACHE_NO_INTERNAL);
    SSL_CTX_sess_set_get_cb(ssl_ctx.get(), GetSessionCallback);
  } else {
    SSL_CTX_set_session_cache_mode(ssl_ctx.get(), SSL_SESS_CACHE_BOTH);
  }

  SSL_CTX_set_select_certificate_cb(ssl_ctx.get(), SelectCertificateCallback);

  if (use_old_client_cert_callback) {
    SSL_CTX_set_client_cert_cb(ssl_ctx.get(), ClientCertCallback);
  }

  SSL_CTX_set_next_protos_advertised_cb(ssl_ctx.get(),
                                        NextProtosAdvertisedCallback, NULL);
  if (!select_next_proto.empty() || select_empty_next_proto) {
    SSL_CTX_set_next_proto_select_cb(ssl_ctx.get(), NextProtoSelectCallback,
                                     NULL);
  }

  if (!select_alpn.empty() || decline_alpn || reject_alpn ||
      select_empty_alpn) {
    SSL_CTX_set_alpn_select_cb(ssl_ctx.get(), AlpnSelectCallback, NULL);
  }

  SSL_CTX_set_current_time_cb(ssl_ctx.get(), CurrentTimeCallback);

  SSL_CTX_set_info_callback(ssl_ctx.get(), InfoCallback);
  SSL_CTX_sess_set_new_cb(ssl_ctx.get(), NewSessionCallback);

  if (use_ticket_aead_callback) {
    SSL_CTX_set_ticket_aead_method(ssl_ctx.get(), &g_async_ticket_aead_method);
  } else if (use_ticket_callback || handshake_hints) {
    // If using handshake hints, always enable some ticket callback, so we can
    // check that hints only mismatch when allowed. The ticket callback also
    // uses a constant key, which simplifies the test.
    SSL_CTX_set_tlsext_ticket_key_cb(ssl_ctx.get(), TicketKeyCallback);
  }

  if (!use_custom_verify_callback) {
    SSL_CTX_set_cert_verify_callback(ssl_ctx.get(), CertVerifyCallback, NULL);
  }

  if (!signed_cert_timestamps.empty() &&
      !SSL_CTX_set_signed_cert_timestamp_list(
          ssl_ctx.get(), (const uint8_t *)signed_cert_timestamps.data(),
          signed_cert_timestamps.size())) {
    return nullptr;
  }

  if (!use_client_ca_list.empty()) {
    if (use_client_ca_list == "<NULL>") {
      SSL_CTX_set_client_CA_list(ssl_ctx.get(), nullptr);
    } else if (use_client_ca_list == "<EMPTY>") {
      bssl::UniquePtr<STACK_OF(X509_NAME)> names;
      SSL_CTX_set_client_CA_list(ssl_ctx.get(), names.release());
    } else {
      bssl::UniquePtr<STACK_OF(X509_NAME)> names =
          DecodeHexX509Names(use_client_ca_list);
      SSL_CTX_set_client_CA_list(ssl_ctx.get(), names.release());
    }
  }

  if (enable_grease) {
    SSL_CTX_set_grease_enabled(ssl_ctx.get(), 1);
  }

  if (permute_extensions) {
    SSL_CTX_set_permute_extensions(ssl_ctx.get(), 1);
  }

  if (!expect_server_name.empty()) {
    SSL_CTX_set_tlsext_servername_callback(ssl_ctx.get(), ServerNameCallback);
  }

  if (enable_early_data) {
    SSL_CTX_set_early_data_enabled(ssl_ctx.get(), 1);
  }

  if (allow_unknown_alpn_protos) {
    SSL_CTX_set_allow_unknown_alpn_protos(ssl_ctx.get(), 1);
  }

  if (!verify_prefs.empty()) {
    if (!SSL_CTX_set_verify_algorithm_prefs(ssl_ctx.get(), verify_prefs.data(),
                                            verify_prefs.size())) {
      return nullptr;
    }
  }

  SSL_CTX_set_msg_callback(ssl_ctx.get(), MessageCallback);

  if (allow_false_start_without_alpn) {
    SSL_CTX_set_false_start_allowed_without_alpn(ssl_ctx.get(), 1);
  }

  if (use_ocsp_callback) {
    SSL_CTX_set_tlsext_status_cb(ssl_ctx.get(), LegacyOCSPCallback);
  }

  if (resumption_across_names_enabled) {
    SSL_CTX_set_resumption_across_names_enabled(ssl_ctx.get(), 1);
  }

  if (old_ctx) {
    uint8_t keys[48];
    if (!SSL_CTX_get_tlsext_ticket_keys(old_ctx, &keys, sizeof(keys)) ||
        !SSL_CTX_set_tlsext_ticket_keys(ssl_ctx.get(), keys, sizeof(keys))) {
      return nullptr;
    }
    CopySessions(ssl_ctx.get(), old_ctx);
  } else if (!ticket_key.empty() &&
             !SSL_CTX_set_tlsext_ticket_keys(ssl_ctx.get(), ticket_key.data(),
                                             ticket_key.size())) {
    return nullptr;
  }

  // These mock compression algorithms match the corresponding ones in
  // |addCertCompressionTests|.
  if (!MaybeInstallCertCompressionAlg(
          this, ssl_ctx.get(), 0xff02,
          [](SSL *ssl, CBB *out, const uint8_t *in, size_t in_len) -> int {
            if (!CBB_add_u8(out, 1) || !CBB_add_u8(out, 2) ||
                !CBB_add_u8(out, 3) || !CBB_add_u8(out, 4) ||
                !CBB_add_bytes(out, in, in_len)) {
              return 0;
            }
            return 1;
          },
          [](SSL *ssl, CRYPTO_BUFFER **out, size_t uncompressed_len,
             const uint8_t *in, size_t in_len) -> int {
            if (in_len < 4 || in[0] != 1 || in[1] != 2 || in[2] != 3 ||
                in[3] != 4 || uncompressed_len != in_len - 4) {
              return 0;
            }
            const bssl::Span<const uint8_t> uncompressed(in + 4, in_len - 4);
            *out = CRYPTO_BUFFER_new(uncompressed.data(), uncompressed.size(),
                                     nullptr);
            return *out != nullptr;
          }) ||
      !MaybeInstallCertCompressionAlg(
          this, ssl_ctx.get(), 0xff01,
          [](SSL *ssl, CBB *out, const uint8_t *in, size_t in_len) -> int {
            if (in_len < 2 || in[0] != 0 || in[1] != 0) {
              return 0;
            }
            return CBB_add_bytes(out, in + 2, in_len - 2);
          },
          [](SSL *ssl, CRYPTO_BUFFER **out, size_t uncompressed_len,
             const uint8_t *in, size_t in_len) -> int {
            if (uncompressed_len != 2 + in_len) {
              return 0;
            }
            auto buf = std::make_unique<uint8_t[]>(2 + in_len);
            buf[0] = 0;
            buf[1] = 0;
            OPENSSL_memcpy(&buf[2], in, in_len);
            *out = CRYPTO_BUFFER_new(buf.get(), 2 + in_len, nullptr);
            return *out != nullptr;
          }) ||
      !MaybeInstallCertCompressionAlg(
          this, ssl_ctx.get(), 0xff03,
          [](SSL *ssl, CBB *out, const uint8_t *in, size_t in_len) -> int {
            uint8_t byte;
            return RAND_bytes(&byte, 1) &&   //
                   CBB_add_u8(out, byte) &&  //
                   CBB_add_bytes(out, in, in_len);
          },
          [](SSL *ssl, CRYPTO_BUFFER **out, size_t uncompressed_len,
             const uint8_t *in, size_t in_len) -> int {
            if (uncompressed_len + 1 != in_len) {
              return 0;
            }
            *out = CRYPTO_BUFFER_new(in + 1, in_len - 1, nullptr);
            return *out != nullptr;
          })) {
    fprintf(stderr, "SSL_CTX_add_cert_compression_alg failed.\n");
    abort();
  }

  if (server_preference) {
    SSL_CTX_set_options(ssl_ctx.get(), SSL_OP_CIPHER_SERVER_PREFERENCE);
  }

  if (is_quic) {
    SSL_CTX_set_quic_method(ssl_ctx.get(), &g_quic_method);
  }

  return ssl_ctx;
}